

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86JMP(uchar *stream,uint labelID,bool isNear)

{
  int iVar1;
  UnsatisfiedJump local_28;
  byte local_15;
  uint local_14;
  bool isNear_local;
  uchar *puStack_10;
  uint labelID_local;
  uchar *stream_local;
  
  local_14 = labelID & 0x7fffffff;
  if (isNear) {
    *stream = 0xe9;
  }
  else {
    *stream = 0xeb;
  }
  local_15 = isNear;
  puStack_10 = stream;
  UnsatisfiedJump::UnsatisfiedJump(&local_28,local_14,isNear,stream);
  FastVector<UnsatisfiedJump,_false,_false>::push_back(&pendingJumps,&local_28);
  iVar1 = 2;
  if ((local_15 & 1) != 0) {
    iVar1 = 5;
  }
  return iVar1;
}

Assistant:

int x86JMP(unsigned char *stream, unsigned int labelID, bool isNear)
{
	labelID &= 0x7FFFFFFF;

	if(isNear)
		stream[0] = 0xE9;
	else
		stream[0] = 0xEB;

	pendingJumps.push_back(UnsatisfiedJump(labelID, isNear, stream));
	return (isNear ? 5 : 2);
}